

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O0

UniquePtr<struct_stack_st_X509> __thiscall
anon_unknown.dwarf_52317d::CertsToStack
          (anon_unknown_dwarf_52317d *this,vector<x509_st_*,_std::allocator<x509_st_*>_> *certs)

{
  UniquePtr<struct_stack_st_X509> this_00;
  bool bVar1;
  enable_if_t<_internal::StackTraits<stack_st_X509>::kIsConst,_bool> eVar2;
  stack_st_X509 *__p;
  reference ppxVar3;
  pointer sk;
  UniquePtr<typename_internal::StackTraits<stack_st_X509>::Type> local_50;
  X509 *local_48;
  x509_st *cert;
  const_iterator __end1;
  const_iterator __begin1;
  vector<x509_st_*,_std::allocator<x509_st_*>_> *__range1;
  unique_ptr<stack_st_X509,_bssl::internal::Deleter> local_20;
  UniquePtr<struct_stack_st_X509> stack;
  vector<x509_st_*,_std::allocator<x509_st_*>_> *certs_local;
  
  stack._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl =
       (__uniq_ptr_data<stack_st_X509,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<stack_st_X509,_bssl::internal::Deleter,_true,_true>)certs;
  __p = sk_X509_new_null();
  std::unique_ptr<stack_st_X509,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<stack_st_X509,bssl::internal::Deleter> *)&local_20,__p);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_20);
  this_00 = stack;
  if (bVar1) {
    __end1 = std::vector<x509_st_*,_std::allocator<x509_st_*>_>::begin
                       ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)
                        stack._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>.
                        _M_t.super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl);
    cert = (x509_st *)
           std::vector<x509_st_*,_std::allocator<x509_st_*>_>::end
                     ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)
                      this_00._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>.
                      _M_t.super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<x509_st_*const_*,_std::vector<x509_st_*,_std::allocator<x509_st_*>_>_>
                                  *)&cert);
      if (!bVar1) break;
      ppxVar3 = __gnu_cxx::
                __normal_iterator<x509_st_*const_*,_std::vector<x509_st_*,_std::allocator<x509_st_*>_>_>
                ::operator*(&__end1);
      local_48 = *ppxVar3;
      sk = std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::get(&local_20);
      bssl::UpRef((bssl *)&local_50,local_48);
      eVar2 = bssl::PushToStack<stack_st_X509>(sk,&local_50);
      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&local_50);
      if (((eVar2 ^ 0xffU) & 1) != 0) {
        std::unique_ptr<stack_st_X509,bssl::internal::Deleter>::
        unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<stack_st_X509,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
        goto LAB_00590e84;
      }
      __gnu_cxx::
      __normal_iterator<x509_st_*const_*,_std::vector<x509_st_*,_std::allocator<x509_st_*>_>_>::
      operator++(&__end1);
    }
    std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::unique_ptr
              ((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)this,&local_20);
  }
  else {
    std::unique_ptr<stack_st_X509,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<stack_st_X509,bssl::internal::Deleter> *)this,(nullptr_t)0x0);
  }
LAB_00590e84:
  std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr(&local_20);
  return (__uniq_ptr_data<stack_st_X509,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<stack_st_X509,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

static bssl::UniquePtr<STACK_OF(X509)> CertsToStack(
    const std::vector<X509 *> &certs) {
  bssl::UniquePtr<STACK_OF(X509)> stack(sk_X509_new_null());
  if (!stack) {
    return nullptr;
  }
  for (auto cert : certs) {
    if (!bssl::PushToStack(stack.get(), bssl::UpRef(cert))) {
      return nullptr;
    }
  }

  return stack;
}